

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::DrawBuffersTest::iterate(DrawBuffersTest *this)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ContextType ctxType;
  ApiType requiredApiType;
  deUint32 dVar6;
  value_type vVar7;
  int iVar8;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  ContextInfo *this_00;
  size_type sVar11;
  reference pvVar12;
  TestContext *pTVar13;
  TestLog *pTVar14;
  MessageBuilder *pMVar15;
  undefined4 *puVar16;
  float fVar17;
  Enum<int,_2UL> EVar18;
  int local_70c;
  GLint i_4;
  Enum<int,_2UL> local_6f8;
  MessageBuilder local_6e8;
  int local_568;
  undefined4 local_564;
  GLenum error_1;
  GLenum none_bufs;
  uint local_3dc;
  float fStack_3d8;
  GLuint j;
  GLfloat rgba [4];
  int local_3c0;
  int local_3bc;
  GLint i_3;
  GLint i_2;
  Enum<int,_2UL> local_3a8;
  MessageBuilder local_398;
  int local_214;
  undefined1 local_210 [4];
  GLenum error;
  int local_8c;
  int local_88;
  GLint i_1;
  GLint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> color_attachments;
  allocator<unsigned_int> local_51;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> renderbuffers;
  GLint max_color_attachments;
  GLuint framebuffer;
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  Functions *gl;
  DrawBuffersTest *this_local;
  long lVar10;
  
  pRVar9 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*pRVar9->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar5);
  pRVar9 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar9->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar3 = glu::contextSupports(ctxType,requiredApiType);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar4 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar3) || (bVar4)) {
    renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 8;
    (**(code **)(lVar10 + 0x868))
              (0x8cdf,&renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"glGetIntegerv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x60c);
    sVar11 = (size_type)
             (int)renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::allocator<unsigned_int>::allocator(&local_51);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,sVar11,&local_51);
    std::allocator<unsigned_int>::~allocator(&local_51);
    sVar11 = (size_type)
             (int)renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&i_1 + 3));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,sVar11,
               (allocator<unsigned_int> *)((long)&i_1 + 3));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&i_1 + 3));
    for (local_88 = 0;
        local_88 <
        (int)renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage; local_88 = local_88 + 1) {
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                           (long)local_88);
      *pvVar12 = 0;
      vVar7 = local_88 + 0x8ce0;
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,(long)local_88)
      ;
      *pvVar12 = vVar7;
    }
    (**(code **)(lVar10 + 0x6d0))
              (1,(undefined1 *)
                 ((long)&renderbuffers.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"glGenFramebuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x61b);
    (**(code **)(lVar10 + 0x78))
              (0x8d40,renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"glBindFramebuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x61e);
    iVar5 = (int)renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar1 = *(code **)(lVar10 + 0x6e8);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,0);
    (*pcVar1)(iVar5,pvVar12);
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"glGenRenderbuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x621);
    for (local_8c = 0;
        local_8c <
        (int)renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage; local_8c = local_8c + 1) {
      pcVar1 = *(code **)(lVar10 + 0xa0);
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                           (long)local_8c);
      (*pcVar1)(0x8d41,*pvVar12);
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"glBindRenderbuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x627);
      (**(code **)(lVar10 + 0x1238))(0x8d41,0x8814,1);
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"glRenderbufferStorage has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x62a);
      pcVar1 = *(code **)(lVar10 + 0x688);
      iVar5 = local_8c + 0x8ce0;
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                           (long)local_8c);
      (*pcVar1)(0x8d40,iVar5,0x8d41,*pvVar12);
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"glFramebufferRenderbuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x62d);
    }
    iVar8 = (**(code **)(lVar10 + 0x170))(0x8d40);
    iVar2 = renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    iVar5 = (int)renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar8 != 0x8cd5) {
      pTVar13 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar14 = tcu::TestContext::getLog(pTVar13);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_210,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar15 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_210,
                           (char (*) [40])"Framebuffer is unexpectedly incomplete.");
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_210);
      puVar16 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar16 = 0;
      __cxa_throw(puVar16,&int::typeinfo,0);
    }
    pcVar1 = *(code **)(lVar10 + 0xef8);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,0);
    (*pcVar1)(iVar2,iVar5,pvVar12);
    local_214 = (**(code **)(lVar10 + 0x800))();
    bVar3 = local_214 != 0;
    if (bVar3) {
      pTVar13 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar14 = tcu::TestContext::getLog(pTVar13);
      tcu::TestLog::operator<<(&local_398,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar15 = tcu::MessageBuilder::operator<<
                          (&local_398,
                           (char (*) [52])"NamedFramebufferDrawBuffers unexpectedly generated ");
      EVar18 = glu::getErrorStr(local_214);
      local_3a8.m_getName = EVar18.m_getName;
      local_3a8.m_value = EVar18.m_value;
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_3a8);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [20])" error. Test fails.");
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_398);
    }
    max_color_attachments._2_1_ = !bVar3;
    for (local_3bc = 0;
        local_3bc <
        (int)renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage; local_3bc = local_3bc + 1) {
      (**(code **)(lVar10 + 0x1c0))(0,0x3e800000,0x3f000000);
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"glClearColor has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x648);
      (**(code **)(lVar10 + 0x188))(0x4000);
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"glClear has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x64b);
    }
    for (local_3c0 = 0;
        local_3c0 <
        (int)renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage; local_3c0 = local_3c0 + 1) {
      (**(code **)(lVar10 + 0x1218))(local_3c0 + 0x8ce0);
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"glReadBuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x652);
      fStack_3d8 = -1.0;
      j = 0xbf800000;
      rgba[0] = -1.0;
      rgba[1] = -1.0;
      (**(code **)(lVar10 + 0x1220))(0,0,1,1,0x1908,0x1406,&fStack_3d8);
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"glReadPixels has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x657);
      for (local_3dc = 0; local_3dc < 4; local_3dc = local_3dc + 1) {
        fVar17 = de::abs<float>((float)(&s_rgba)[local_3dc] - (&fStack_3d8)[local_3dc]);
        if (0.0001 < fVar17) {
          pTVar13 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar14 = tcu::TestContext::getLog(pTVar13);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)&error_1,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message)
          ;
          pMVar15 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)&error_1,
                               (char (*) [84])
                               "Named Framebuffer Draw Buffers test have failed because resulting color value was ["
                              );
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&fStack_3d8);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a3caab);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(float *)&j);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a3caab);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,rgba);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a3caab);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,rgba + 1);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [8])"] but [");
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(float *)&s_rgba);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a3caab);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(float *)&DAT_02a6d9a4);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a3caab);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(float *)&DAT_02a6d9a8);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [3])0x2a3caab);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(float *)&DAT_02a6d9ac);
          pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [21])"] had been expected.");
          tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&error_1);
          max_color_attachments._2_1_ = false;
          break;
        }
      }
    }
    local_564 = 0;
    (**(code **)(lVar10 + 0xef8))
              (renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage._4_4_,1,&local_564);
    local_568 = (**(code **)(lVar10 + 0x800))();
    if (local_568 != 0) {
      pTVar13 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar14 = tcu::TestContext::getLog(pTVar13);
      tcu::TestLog::operator<<(&local_6e8,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar15 = tcu::MessageBuilder::operator<<
                          (&local_6e8,
                           (char (*) [52])"NamedFramebufferDrawBuffers unexpectedly generated ");
      EVar18 = glu::getErrorStr(local_568);
      local_6f8.m_getName = EVar18.m_getName;
      local_6f8.m_value = EVar18.m_value;
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_6f8);
      pMVar15 = tcu::MessageBuilder::operator<<
                          (pMVar15,(char (*) [38])" error with GL_NONE mode. Test fails.");
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_6e8);
      max_color_attachments._2_1_ = false;
    }
    if (renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
      (**(code **)(lVar10 + 0x440))(1);
      renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    for (local_70c = 0;
        local_70c <
        (int)renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage; local_70c = local_70c + 1) {
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                           (long)local_70c);
      if (*pvVar12 != 0) {
        pcVar1 = *(code **)(lVar10 + 0x460);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,(long)local_70c);
        (*pcVar1)(1);
      }
    }
    (**(code **)(lVar10 + 0x1c0))(0,0,0);
    do {
      iVar5 = (**(code **)(lVar10 + 0x800))();
    } while (iVar5 != 0);
    if (max_color_attachments._2_1_) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DrawBuffersTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Framebuffers' objects */
	glw::GLuint framebuffer = 0;

	/* Get number of color attachments. */
	glw::GLint max_color_attachments = 8 /* Specification minimum OpenGL 4.5 Core Profile p. 627 */;

	gl.getIntegerv(GL_MAX_COLOR_ATTACHMENTS, &max_color_attachments);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

	std::vector<glw::GLuint> renderbuffers(max_color_attachments);
	std::vector<glw::GLuint> color_attachments(max_color_attachments);

	for (glw::GLint i = 0; i < max_color_attachments; ++i)
	{
		renderbuffers[i]	 = 0;
		color_attachments[i] = GL_COLOR_ATTACHMENT0 + i;
	}

	try
	{
		/* Prepare framebuffer... */
		gl.genFramebuffers(1, &framebuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

		gl.bindFramebuffer(GL_FRAMEBUFFER, framebuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffers has failed");

		gl.genRenderbuffers(max_color_attachments, &(renderbuffers[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers has failed");

		/* .. with renderbuffer color attachments. */
		for (glw::GLint i = 0; i < max_color_attachments; ++i)
		{
			gl.bindRenderbuffer(GL_RENDERBUFFER, renderbuffers[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer has failed");

			gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA32F, 1, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

			gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, GL_RENDERBUFFER, renderbuffers[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");
		}

		/* Check that framebuffer is complete. */
		if (GL_FRAMEBUFFER_COMPLETE != gl.checkFramebufferStatus(GL_FRAMEBUFFER))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Framebuffer is unexpectedly incomplete."
												<< tcu::TestLog::EndMessage;

			throw 0;
		}

		/* Set up all attachments as draw buffer. */
		gl.namedFramebufferDrawBuffers(framebuffer, max_color_attachments, &(color_attachments[0]));

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "NamedFramebufferDrawBuffers unexpectedly generated "
				<< glu::getErrorStr(error) << " error. Test fails." << tcu::TestLog::EndMessage;
			is_ok = false;
		}

		/* Clear each of the framebuffer's attachments with unique color using NamedFramebufferDrawBuffer for attachment selection. */
		for (glw::GLint i = 0; i < max_color_attachments; ++i)
		{
			gl.clearColor(s_rgba[0], s_rgba[1], s_rgba[2], s_rgba[3]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor has failed");

			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glClear has failed");
		}

		/* Fetch framebuffer's content and compare it with reference using NamedFramebufferReadBuffer for attachment selection. */
		for (glw::GLint i = 0; i < max_color_attachments; ++i)
		{
			gl.readBuffer(GL_COLOR_ATTACHMENT0 + i);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadBuffer has failed");

			glw::GLfloat rgba[4] = { -1.f, -1.f, -1.f, -1.f };

			gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_FLOAT, rgba);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

			for (glw::GLuint j = 0; j < 4 /* number of components */; ++j)
			{
				if (de::abs(s_rgba[j] - rgba[j]) > 0.0001 /* Precision */)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message
						<< "Named Framebuffer Draw Buffers test have failed because resulting color value was ["
						<< rgba[0] << ", " << rgba[1] << ", " << rgba[2] << ", " << rgba[3] << "] but [" << s_rgba[0]
						<< ", " << s_rgba[1] << ", " << s_rgba[2] << ", " << s_rgba[3] << "] had been expected."
						<< tcu::TestLog::EndMessage;

					is_ok = false;

					break;
				}
			}
		}

		/* Check that NamedFramebufferDrawBuffers accepts GL_NONE as mode. */
		glw::GLenum none_bufs = GL_NONE;
		gl.namedFramebufferDrawBuffers(framebuffer, 1, &none_bufs);

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "NamedFramebufferDrawBuffers unexpectedly generated "
				<< glu::getErrorStr(error) << " error with GL_NONE mode. Test fails." << tcu::TestLog::EndMessage;
			is_ok = false;
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (framebuffer)
	{
		gl.deleteFramebuffers(1, &framebuffer);

		framebuffer = 0;
	}

	for (glw::GLint i = 0; i < max_color_attachments; ++i)
	{
		if (renderbuffers[i])
		{
			gl.deleteRenderbuffers(1, &(renderbuffers[i]));
		}
	}

	gl.clearColor(0.f, 0.f, 0.f, 0.f);

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}